

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvahammer.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  uint32_t b;
  uint32_t a;
  int cnum;
  int c;
  uint32_t local_20;
  uint32_t local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_18 = 0;
    while (local_14 = getopt(local_8,local_10,"c:"), local_14 != -1) {
      if (local_14 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_18);
      }
    }
    if (local_18 < nva_cardsnum) {
      if (_optind < local_8) {
        if (_optind + 1 < local_8) {
          __isoc99_sscanf(local_10[_optind],"%x",&local_1c);
          __isoc99_sscanf(local_10[_optind + 1],"%x",&local_20);
          do {
            nva_wr32(local_18,local_1c,local_20);
          } while( true );
        }
        fprintf(_stderr,"No value specified.\n");
      }
      else {
        fprintf(_stderr,"No address specified.\n");
      }
    }
    else if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	uint32_t a, b;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	sscanf (argv[optind + 1], "%x", &b);
	while (1)
		nva_wr32(cnum, a, b);
	return 0;
}